

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O1

void duckdb::QuantileListFallback::
     Finalize<duckdb::list_entry_t,duckdb::QuantileState<duckdb::string_t,duckdb::QuantileStringType>>
               (QuantileState<duckdb::string_t,_duckdb::QuantileStringType> *state,
               list_entry_t *target,AggregateFinalizeData *finalize_data)

{
  AggregateInputData *this;
  FunctionData *pFVar1;
  _func_int **pp_Var2;
  idx_t iVar3;
  reference q_00;
  idx_t iVar4;
  uint64_t uVar5;
  OrderModifiers in_R9W;
  unsigned_long *q;
  _func_int **pp_Var6;
  idx_t n;
  RESULT_TYPE RVar7;
  string_t sort_key;
  Interpolator<true> interp;
  QuantileDirect<duckdb::string_t> local_81;
  FunctionData *local_80;
  list_entry_t *local_78;
  AggregateFinalizeData *local_70;
  vector<duckdb::QuantileValue,_true> *local_68;
  Vector *local_60;
  Interpolator<true> local_58;
  
  if ((state->v).super_vector<duckdb::string_t,_std::allocator<duckdb::string_t>_>.
      super__Vector_base<duckdb::string_t,_std::allocator<duckdb::string_t>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (state->v).super_vector<duckdb::string_t,_std::allocator<duckdb::string_t>_>.
      super__Vector_base<duckdb::string_t,_std::allocator<duckdb::string_t>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    this = finalize_data->input;
    optional_ptr<duckdb::FunctionData,_true>::CheckValid(&this->bind_data);
    pFVar1 = (this->bind_data).ptr;
    local_60 = ListVector::GetEntry(finalize_data->result);
    iVar3 = ListVector::GetListSize(finalize_data->result);
    local_70 = finalize_data;
    ListVector::Reserve(finalize_data->result,
                        ((long)pFVar1[2]._vptr_FunctionData - (long)pFVar1[1]._vptr_FunctionData >>
                        3) * 0x4ec4ec4ec4ec4ec5 + iVar3);
    target->offset = iVar3;
    pp_Var6 = pFVar1[4]._vptr_FunctionData;
    pp_Var2 = pFVar1[5]._vptr_FunctionData;
    local_80 = pFVar1;
    local_78 = target;
    if (pp_Var6 != pp_Var2) {
      local_68 = (vector<duckdb::QuantileValue,_true> *)(pFVar1 + 1);
      iVar4 = 0;
      do {
        q_00 = vector<duckdb::QuantileValue,_true>::operator[](local_68,(size_type)*pp_Var6);
        n = (long)(state->v).super_vector<duckdb::string_t,_std::allocator<duckdb::string_t>_>.
                  super__Vector_base<duckdb::string_t,_std::allocator<duckdb::string_t>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(state->v).super_vector<duckdb::string_t,_std::allocator<duckdb::string_t>_>.
                  super__Vector_base<duckdb::string_t,_std::allocator<duckdb::string_t>_>._M_impl.
                  super__Vector_impl_data._M_start >> 4;
        local_58.desc = *(bool *)&local_80[7]._vptr_FunctionData;
        local_58.FRN = Interpolator<true>::Index(q_00,n);
        local_58.CRN = local_58.FRN;
        local_58.begin = iVar4;
        local_58.end = n;
        RVar7 = Interpolator<true>::
                InterpolateInternal<duckdb::string_t,duckdb::QuantileDirect<duckdb::string_t>>
                          (&local_58,
                           (state->v).
                           super_vector<duckdb::string_t,_std::allocator<duckdb::string_t>_>.
                           super__Vector_base<duckdb::string_t,_std::allocator<duckdb::string_t>_>.
                           _M_impl.super__Vector_impl_data._M_start,&local_81);
        sort_key.value.pointer.ptr = (char *)local_60;
        sort_key.value._0_8_ = RVar7.value._8_8_;
        CreateSortKeyHelpers::DecodeSortKey
                  (RVar7.value._0_8_,sort_key,(Vector *)(*pp_Var6 + iVar3),0x302,in_R9W);
        pp_Var6 = pp_Var6 + 1;
        iVar4 = local_58.FRN;
      } while (pp_Var6 != pp_Var2);
    }
    uVar5 = ((long)local_80[2]._vptr_FunctionData - (long)local_80[1]._vptr_FunctionData >> 3) *
            0x4ec4ec4ec4ec4ec5;
    local_78->length = uVar5;
    ListVector::SetListSize(local_70->result,uVar5 + local_78->offset);
    return;
  }
  AggregateFinalizeData::ReturnNull(finalize_data);
  return;
}

Assistant:

static void Finalize(STATE &state, T &target, AggregateFinalizeData &finalize_data) {
		if (state.v.empty()) {
			finalize_data.ReturnNull();
			return;
		}

		D_ASSERT(finalize_data.input.bind_data);
		auto &bind_data = finalize_data.input.bind_data->Cast<QuantileBindData>();

		auto &result = ListVector::GetEntry(finalize_data.result);
		auto ridx = ListVector::GetListSize(finalize_data.result);
		ListVector::Reserve(finalize_data.result, ridx + bind_data.quantiles.size());

		D_ASSERT(state.v.data());

		auto &entry = target;
		entry.offset = ridx;
		idx_t lower = 0;
		for (const auto &q : bind_data.order) {
			const auto &quantile = bind_data.quantiles[q];
			Interpolator<true> interp(quantile, state.v.size(), bind_data.desc);
			interp.begin = lower;
			auto interpolation_result = interp.InterpolateInternal<string_t>(state.v.data());
			CreateSortKeyHelpers::DecodeSortKey(interpolation_result, result, ridx + q,
			                                    OrderModifiers(OrderType::ASCENDING, OrderByNullType::NULLS_LAST));
			lower = interp.FRN;
		}
		entry.length = bind_data.quantiles.size();

		ListVector::SetListSize(finalize_data.result, entry.offset + entry.length);
	}